

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937-64.c
# Opt level: O2

unsigned_long_long genrand64_int64(void)

{
  unsigned_long_long uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((long)mti < 0x138) {
    uVar1 = mt[mti];
    mti = mti + 1;
  }
  else {
    if (mti == 0x139) {
      init_genrand64(0x1571);
    }
    for (lVar2 = -0x4e0; lVar2 != 0; lVar2 = lVar2 + 8) {
      uVar4 = (uint)*(undefined8 *)((long)mt + lVar2 + 0x4e8);
      *(unsigned_long_long *)((long)mt + lVar2 + 0x4e0) =
           genrand64_int64::mag01[uVar4 & 1] ^ *(ulong *)(&_end + lVar2) ^
           ((ulong)(uVar4 & 0x7ffffffe) | *(ulong *)((long)mt + lVar2 + 0x4e0) & 0xffffffff80000000)
           >> 1;
    }
    for (lVar2 = 0; lVar2 != 0x9b; lVar2 = lVar2 + 1) {
      mt[lVar2 + 0x9c] =
           genrand64_int64::mag01[(uint)mt[lVar2 + 0x9d] & 1] ^ mt[lVar2] ^
           ((ulong)((uint)mt[lVar2 + 0x9d] & 0x7ffffffe) | mt[lVar2 + 0x9c] & 0xffffffff80000000) >>
           1;
    }
    mt[0x137] = genrand64_int64::mag01[(uint)mt[0] & 1] ^ mt[0x9b] ^
                ((ulong)((uint)mt[0] & 0x7ffffffe) | mt[0x137] & 0xffffffff80000000) >> 1;
    mti = 1;
    uVar1 = mt[0];
  }
  uVar3 = uVar1 >> 0x1d & 0x555555555 ^ uVar1;
  uVar3 = (uVar3 & 0x38eb3ffff6d3) << 0x11 ^ uVar3;
  uVar3 = (ulong)((uint)uVar3 & 0x7ffbf77) << 0x25 ^ uVar3;
  return uVar3 >> 0x2b ^ uVar3;
}

Assistant:

unsigned long long genrand64_int64(void)
{
    int i;
    unsigned long long x;
    static unsigned long long mag01[2]={0ULL, MATRIX_A};

    if (mti >= NN) { /* generate NN words at one time */

        /* if init_genrand64() has not been called, */
        /* a default initial seed is used     */
        if (mti == NN+1) 
            init_genrand64(5489ULL); 

        for (i=0;i<NN-MM;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+MM] ^ (x>>1) ^ mag01[(int)(x&1ULL)];
        }
        for (;i<NN-1;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+(MM-NN)] ^ (x>>1) ^ mag01[(int)(x&1ULL)];
        }
        x = (mt[NN-1]&UM)|(mt[0]&LM);
        mt[NN-1] = mt[MM-1] ^ (x>>1) ^ mag01[(int)(x&1ULL)];

        mti = 0;
    }
  
    x = mt[mti++];

    x ^= (x >> 29) & 0x5555555555555555ULL;
    x ^= (x << 17) & 0x71D67FFFEDA60000ULL;
    x ^= (x << 37) & 0xFFF7EEE000000000ULL;
    x ^= (x >> 43);

    return x;
}